

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

psa_status_t
psa_its_get(psa_storage_uid_t uid,uint32_t data_offset,uint32_t data_length,void *p_data,
           size_t *p_data_length)

{
  int iVar1;
  psa_storage_info_t pVar2;
  psa_storage_info_t local_48;
  psa_storage_info_t info;
  size_t n;
  FILE *stream;
  psa_storage_info_t *ppStack_28;
  psa_status_t status;
  size_t *p_data_length_local;
  void *p_data_local;
  uint32_t data_length_local;
  uint32_t data_offset_local;
  psa_storage_uid_t uid_local;
  
  n = 0;
  ppStack_28 = (psa_storage_info_t *)p_data_length;
  p_data_length_local = (size_t *)p_data;
  p_data_local._0_4_ = data_length;
  p_data_local._4_4_ = data_offset;
  _data_length_local = uid;
  stream._4_4_ = psa_its_read_file(uid,&local_48,(FILE **)&n);
  if (((stream._4_4_ == 0) &&
      (stream._4_4_ = -0x87, p_data_local._4_4_ <= p_data_local._4_4_ + (uint32_t)p_data_local)) &&
     (p_data_local._4_4_ + (uint32_t)p_data_local <= local_48.size)) {
    stream._4_4_ = -0x92;
    iVar1 = fseek((FILE *)n,(ulong)p_data_local._4_4_,1);
    if (((iVar1 == 0) &&
        (info = (psa_storage_info_t)
                fread(p_data_length_local,1,(ulong)(uint32_t)p_data_local,(FILE *)n),
        pVar2.flags = 0, pVar2.size = (uint32_t)p_data_local, info == pVar2)) &&
       (stream._4_4_ = 0, ppStack_28 != (psa_storage_info_t *)0x0)) {
      *ppStack_28 = info;
    }
  }
  if (n != 0) {
    fclose((FILE *)n);
  }
  return stream._4_4_;
}

Assistant:

psa_status_t psa_its_get( psa_storage_uid_t uid,
                          uint32_t data_offset,
                          uint32_t data_length,
                          void *p_data,
                          size_t *p_data_length )
{
    psa_status_t status;
    FILE *stream = NULL;
    size_t n;
    struct psa_storage_info_t info;

    status = psa_its_read_file( uid, &info, &stream );
    if( status != PSA_SUCCESS )
        goto exit;
    status = PSA_ERROR_INVALID_ARGUMENT;
    if( data_offset + data_length < data_offset )
        goto exit;
#if SIZE_MAX < 0xffffffff
    if( data_offset + data_length > SIZE_MAX )
        goto exit;
#endif
    if( data_offset + data_length > info.size )
        goto exit;

    status = PSA_ERROR_STORAGE_FAILURE;
#if LONG_MAX < 0xffffffff
    while( data_offset > LONG_MAX )
    {
        if( fseek( stream, LONG_MAX, SEEK_CUR ) != 0 )
            goto exit;
        data_offset -= LONG_MAX;
    }
#endif
    if( fseek( stream, data_offset, SEEK_CUR ) != 0 )
        goto exit;
    n = fread( p_data, 1, data_length, stream );
    if( n != data_length )
        goto exit;
    status = PSA_SUCCESS;
    if( p_data_length != NULL )
        *p_data_length = n;

exit:
    if( stream != NULL )
        fclose( stream );
    return( status );
}